

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall Dfa::Nfa_to_Dfa(Dfa *this,Nfa *nfa)

{
  int iVar1;
  pointer *pppFVar2;
  _Rb_tree_header *p_Var3;
  undefined1 uVar4;
  pointer ppFVar5;
  iterator iVar6;
  Fa_Node *pFVar7;
  pointer pEVar8;
  pointer pNVar9;
  vector<Fa_Node*,std::allocator<Fa_Node*>> *this_00;
  mapped_type_conflict *pmVar10;
  _Base_ptr p_Var11;
  _Rb_tree_node_base *p_Var12;
  iterator iVar13;
  _Base_ptr p_Var14;
  bool bVar15;
  long lVar16;
  pointer pEVar17;
  long lVar18;
  char i;
  Fa_Node *tp_Node;
  vector<Node_num,_std::allocator<Node_num>_> num;
  Node_num tp_num;
  map<Node_num,_int,_std::less<Node_num>,_std::allocator<std::pair<const_Node_num,_int>_>_> trans;
  int local_ec;
  vector<Fa_Node*,std::allocator<Fa_Node*>> *local_e8;
  Dfa *local_e0;
  ulong local_d8;
  long local_d0;
  Fa_Node *local_c8;
  _Base_ptr local_c0;
  vector<Node_num,_std::allocator<Node_num>_> local_b8;
  vector<Fa_Node*,std::allocator<Fa_Node*>> *local_98;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_90;
  _Rb_tree<Node_num,_std::pair<const_Node_num,_int>,_std::_Select1st<std::pair<const_Node_num,_int>_>,_std::less<Node_num>,_std::allocator<std::pair<const_Node_num,_int>_>_>
  local_60;
  
  ppFVar5 = (this->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppFVar5) {
    (this->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppFVar5;
  }
  (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_p =
       (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p;
  (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_offset = 0;
  ppFVar5 = (this->begin).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->begin).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppFVar5) {
    (this->begin).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppFVar5;
  }
  local_e8 = (vector<Fa_Node*,std::allocator<Fa_Node*>> *)&this->Node;
  ppFVar5 = (this->end).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->end).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppFVar5) {
    (this->end).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppFVar5;
  }
  local_e0 = this;
  std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::resize
            ((vector<Fa_Node_*,_std::allocator<Fa_Node_*>_> *)local_e8,1);
  local_b8.super__Vector_base<Node_num,_std::allocator<Node_num>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<Node_num,_std::allocator<Node_num>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b8.super__Vector_base<Node_num,_std::allocator<Node_num>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<Node_num,_std::allocator<Node_num>_>::resize(&local_b8,1);
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_ec = 1;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < nfa->n) {
    do {
      if ((nfa->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
          super__Vector_impl_data._M_start[local_ec]->start == true) {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_90,&local_ec);
      }
      iVar1 = local_ec + 1;
      bVar15 = local_ec < nfa->n;
      local_ec = iVar1;
    } while (bVar15);
  }
  pmVar10 = std::
            map<Node_num,_int,_std::less<Node_num>,_std::allocator<std::pair<const_Node_num,_int>_>_>
            ::operator[]((map<Node_num,_int,_std::less<Node_num>,_std::allocator<std::pair<const_Node_num,_int>_>_>
                          *)&local_60,(key_type *)&local_90);
  p_Var3 = &local_90._M_impl.super__Rb_tree_header;
  *pmVar10 = 1;
  std::vector<Node_num,_std::allocator<Node_num>_>::push_back(&local_b8,(value_type *)&local_90);
  if ((_Rb_tree_header *)local_90._M_impl.super__Rb_tree_header._M_header._M_left == p_Var3) {
    bVar15 = false;
  }
  else {
    ppFVar5 = (nfa->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    bVar15 = false;
    p_Var11 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      if (ppFVar5[(int)p_Var11[1]._M_color]->end != false) {
        bVar15 = true;
      }
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while ((_Rb_tree_header *)p_Var11 != p_Var3);
  }
  local_c8 = (Fa_Node *)operator_new(0x28);
  (local_c8->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (local_c8->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (local_c8->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_c8->n = 1;
  local_c8->start = true;
  local_c8->end = bVar15;
  local_c8->temp = false;
  iVar6._M_current =
       (local_e0->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar6._M_current ==
      (local_e0->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Fa_Node*,std::allocator<Fa_Node*>>::_M_realloc_insert<Fa_Node*const&>
              (local_e8,iVar6,&local_c8);
  }
  else {
    *iVar6._M_current = local_c8;
    pppFVar2 = &(local_e0->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppFVar2 = *pppFVar2 + 1;
  }
  local_98 = (vector<Fa_Node*,std::allocator<Fa_Node*>> *)&local_e0->end;
  local_d8 = 2;
  local_d0 = 1;
  p_Var11 = all_char._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    for (; this_00 = local_98,
        (_Rb_tree_header *)p_Var11 != &all_char._M_t._M_impl.super__Rb_tree_header;
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
      uVar4 = (undefined1)p_Var11[1]._M_color;
      local_ec = CONCAT31(local_ec._1_3_,uVar4);
      if (uVar4 != _S_red) {
        local_c0 = p_Var11;
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
                  (&local_90);
        pNVar9 = local_b8.super__Vector_base<Node_num,_std::allocator<Node_num>_>._M_impl.
                 super__Vector_impl_data._M_start + local_d0;
        p_Var12 = local_b8.super__Vector_base<Node_num,_std::allocator<Node_num>_>._M_impl.
                  super__Vector_impl_data._M_start[local_d0].n._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
        p_Var11 = local_c0;
        while (local_c0 = p_Var11,
              (_Rb_tree_header *)p_Var12 != &(pNVar9->n)._M_t._M_impl.super__Rb_tree_header) {
          pFVar7 = (nfa->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)p_Var12[1]._M_color];
          pEVar8 = *(pointer *)
                    ((long)&(pFVar7->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl +
                    8);
          for (pEVar17 = (pFVar7->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                         super__Vector_impl_data._M_start; pEVar17 != pEVar8; pEVar17 = pEVar17 + 1)
          {
            if (pEVar17->c == (char)local_ec) {
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )&local_90,&pEVar17->v->n);
            }
          }
          p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
          p_Var11 = local_c0;
        }
        if (local_90._M_impl.super__Rb_tree_header._M_node_count != 0) {
          iVar13 = std::
                   _Rb_tree<Node_num,_std::pair<const_Node_num,_int>,_std::_Select1st<std::pair<const_Node_num,_int>_>,_std::less<Node_num>,_std::allocator<std::pair<const_Node_num,_int>_>_>
                   ::find(&local_60,(key_type *)&local_90);
          p_Var11 = local_c0;
          p_Var3 = &local_90._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)iVar13._M_node == &local_60._M_impl.super__Rb_tree_header) {
            pmVar10 = std::
                      map<Node_num,_int,_std::less<Node_num>,_std::allocator<std::pair<const_Node_num,_int>_>_>
                      ::operator[]((map<Node_num,_int,_std::less<Node_num>,_std::allocator<std::pair<const_Node_num,_int>_>_>
                                    *)&local_60,(key_type *)&local_90);
            *pmVar10 = (mapped_type_conflict)local_d8;
            std::vector<Node_num,_std::allocator<Node_num>_>::push_back
                      (&local_b8,(value_type *)&local_90);
            if ((_Rb_tree_header *)local_90._M_impl.super__Rb_tree_header._M_header._M_left ==
                p_Var3) {
              bVar15 = false;
            }
            else {
              ppFVar5 = (nfa->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              bVar15 = false;
              p_Var14 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
              do {
                if (ppFVar5[(int)p_Var14[1]._M_color]->end != false) {
                  bVar15 = true;
                }
                p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
                p_Var11 = local_c0;
              } while ((_Rb_tree_header *)p_Var14 != p_Var3);
            }
            local_c8 = (Fa_Node *)operator_new(0x28);
            (local_c8->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (local_c8->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (local_c8->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_c8->n = (int)local_d8;
            local_c8->start = false;
            local_c8->end = bVar15;
            local_c8->temp = false;
            iVar6._M_current =
                 (local_e0->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar6._M_current ==
                (local_e0->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<Fa_Node*,std::allocator<Fa_Node*>>::_M_realloc_insert<Fa_Node*const&>
                        (local_e8,iVar6,&local_c8);
            }
            else {
              *iVar6._M_current = local_c8;
              pppFVar2 = &(local_e0->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppFVar2 = *pppFVar2 + 1;
            }
            std::vector<Edge,std::allocator<Edge>>::emplace_back<Fa_Node*&,char&>
                      ((vector<Edge,std::allocator<Edge>> *)
                       (*(long *)(*(long *)local_e8 + local_d0 * 8) + 8),&local_c8,(char *)&local_ec
                      );
            local_d8 = (ulong)((int)local_d8 + 1);
          }
          else {
            lVar16 = *(long *)(*(long *)local_e8 + local_d0 * 8);
            pmVar10 = std::
                      map<Node_num,_int,_std::less<Node_num>,_std::allocator<std::pair<const_Node_num,_int>_>_>
                      ::operator[]((map<Node_num,_int,_std::less<Node_num>,_std::allocator<std::pair<const_Node_num,_int>_>_>
                                    *)&local_60,(key_type *)&local_90);
            std::vector<Edge,std::allocator<Edge>>::emplace_back<Fa_Node*&,char&>
                      ((vector<Edge,std::allocator<Edge>> *)(lVar16 + 8),
                       (Fa_Node **)((long)*pmVar10 * 8 + *(long *)local_e8),(char *)&local_ec);
          }
        }
      }
    }
    local_d0 = local_d0 + 1;
    p_Var11 = all_char._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  } while (local_d0 < (int)local_d8);
  local_e0->n = (int)local_d8 + -1;
  if (1 < (int)local_d8) {
    lVar16 = 8;
    lVar18 = 0;
    do {
      pFVar7 = *(Fa_Node **)(*(long *)local_e8 + lVar16);
      if (pFVar7->start == true) {
        iVar6._M_current =
             (local_e0->begin).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (local_e0->begin).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Fa_Node*,std::allocator<Fa_Node*>>::_M_realloc_insert<Fa_Node*const&>
                    ((vector<Fa_Node*,std::allocator<Fa_Node*>> *)local_e0,iVar6,
                     (Fa_Node **)(*(long *)local_e8 + lVar16));
        }
        else {
          *iVar6._M_current = pFVar7;
          pppFVar2 = &(local_e0->begin).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppFVar2 = *pppFVar2 + 1;
        }
      }
      pFVar7 = *(Fa_Node **)(*(long *)local_e8 + lVar16);
      if (pFVar7->end == true) {
        iVar6._M_current =
             (local_e0->end).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (local_e0->end).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Fa_Node*,std::allocator<Fa_Node*>>::_M_realloc_insert<Fa_Node*const&>
                    (this_00,iVar6,(Fa_Node **)(*(long *)local_e8 + lVar16));
        }
        else {
          *iVar6._M_current = pFVar7;
          pppFVar2 = &(local_e0->end).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppFVar2 = *pppFVar2 + 1;
        }
      }
      lVar18 = lVar18 + 1;
      lVar16 = lVar16 + 8;
    } while (lVar18 < local_e0->n);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_90);
  std::
  _Rb_tree<Node_num,_std::pair<const_Node_num,_int>,_std::_Select1st<std::pair<const_Node_num,_int>_>,_std::less<Node_num>,_std::allocator<std::pair<const_Node_num,_int>_>_>
  ::~_Rb_tree(&local_60);
  std::vector<Node_num,_std::allocator<Node_num>_>::~vector(&local_b8);
  return;
}

Assistant:

void Dfa::Nfa_to_Dfa(Nfa &nfa) {//NFA -> DFA
    //DFA Node and used vector

    Node.clear();
    used.clear();
    begin.clear();
    end.clear();

    Node.resize(1);

    vector<Node_num> num;
    map<Node_num, int> trans;
    //DFA Node num trans to NFA Node num

    num.resize(1);

    int tot = 1;
    int now = 1;

    Node_num tp_num;
    Fa_Node *tp_Node;
    bool strat_flag = false, end_flag = false;

    //find start Node
    for (int i = 1; i <= nfa.n; i++) {
        if (nfa.Node[i]->start) {
            tp_num.n.insert(i);
        }
    }

    //insert start Node
    trans[tp_num] = tot;
    num.push_back(tp_num);
    strat_flag = false, end_flag = false;
    for (auto i:tp_num.n) {
        if (nfa.Node[i]->end) {
            end_flag = true;
        }
    }
    strat_flag = true;
    tp_Node = new Fa_Node(tot, strat_flag, end_flag);
    Node.push_back(tp_Node);

    tot++;
    while (now < tot) {
        for (auto i:all_char) {// char
            if (i == '\0') {
                continue;
            }
            tp_num.n.clear();
            for (auto j:num[now].n) {// NFA Node num
                for (auto k:nfa.Node[j]->edge) {//Node edge
                    if (k.c == i) {
                        tp_num.n.insert(k.v->n);
                        continue;
                    }
                }
            }
            if (tp_num.n.empty()) {// edge does not exist
                continue;
            }
            if (trans.find(tp_num) != trans.end()) {// Node has been created
                Node[now]->edge.emplace_back(Node[trans[tp_num]], i);
            } else {// creat Node
                trans[tp_num] = tot;
                num.push_back(tp_num);
                strat_flag = false, end_flag = false;
                for (auto j:tp_num.n) {
                    if (nfa.Node[j]->end) {
                        end_flag = true;
                    }
                }
                tp_Node = new Fa_Node(tot, strat_flag, end_flag);
                Node.push_back(tp_Node);

                Node[now]->edge.emplace_back(tp_Node, i);
                tot++;
            }
        }
        now++;
    }

    //update n  begin   end
    n = tot - 1;
    for (int i = 1; i <= n; i++) {
        if (Node[i]->start) {
            begin.push_back(Node[i]);
        }
        if (Node[i]->end) {
            end.push_back(Node[i]);
        }
    }
}